

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O1

Instr * __thiscall
Peeps::PeepCondMove(Peeps *this,LabelInstr *labelInstr,Instr *nextInstr,bool isInHelper)

{
  char cVar1;
  Type pAVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  uint uVar6;
  LabelInstr *pLVar7;
  undefined4 *puVar8;
  LabelInstr *this_00;
  char *message;
  char *error;
  uint lineNumber;
  OpCode OVar9;
  
  pLVar7 = labelInstr;
  while (pLVar7 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pLVar7->super_Instr),
        (pLVar7->super_Instr).m_opcode == MOV) {
    OVar4 = IR::Opnd::GetKind((pLVar7->super_Instr).m_src1);
    if (OVar4 != OpndKindReg) {
      return nextInstr;
    }
    OVar4 = IR::Opnd::GetKind((pLVar7->super_Instr).m_dst);
    if (OVar4 != OpndKindReg) {
      return nextInstr;
    }
  }
  if ((pLVar7->super_Instr).m_kind != InstrKindBranch) {
    return nextInstr;
  }
  OVar9 = (pLVar7->super_Instr).m_opcode;
  if (OVar9 < ADD) {
    bVar5 = OVar9 == MultiBr || OVar9 == Br;
  }
  else {
    bVar5 = LowererMD::IsUnconditionalBranch((Instr *)pLVar7);
  }
  if (bVar5 != false) {
    return nextInstr;
  }
  if ((pLVar7->super_Instr).m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar5) goto LAB_00624ebf;
    *puVar8 = 0;
  }
  pAVar2 = (pLVar7->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
           allocator;
  cVar1 = *(char *)((long)&(pLVar7->labelRefs).
                           super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                           super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                           super_SListNodeBase<Memory::ArenaAllocator>.next + 1);
  if (pAVar2 == (Type)0x0) {
    if (cVar1 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      error = "(m_isMultiBranch)";
      message = "m_isMultiBranch";
      lineNumber = 0x20e;
      goto LAB_00624d3d;
    }
  }
  else if (cVar1 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    error = "(!m_isMultiBranch)";
    message = "!m_isMultiBranch";
    lineNumber = 0x209;
LAB_00624d3d:
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,lineNumber,error,message);
    if (!bVar5) goto LAB_00624ebf;
    *puVar8 = 0;
  }
  if (pAVar2 != (Type)0x0) {
    if ((pLVar7->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar5) goto LAB_00624ebf;
      *puVar8 = 0;
    }
    if (((LabelInstr *)
         (pLVar7->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         allocator == labelInstr) && ((pLVar7->super_Instr).m_opcode != Leave)) {
      this_00 = (LabelInstr *)IR::Instr::AsBranchInstr((Instr *)pLVar7);
      uVar6 = *(int *)&(this_00->super_Instr).m_opcode - 0x41d;
      pLVar7 = this_00;
      if (((ushort)uVar6 < 0x11) && ((0x1fdffU >> (uVar6 & 0x1f) & 1) != 0)) {
        OVar9 = *(OpCode *)(&DAT_01063d6c + (ulong)(uVar6 & 0xffff) * 2);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,0x4dd,"((0))","UNREACHED");
        if (!bVar5) {
LAB_00624ebf:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
        OVar9 = InvalidOpCode;
      }
      while (pLVar7 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&pLVar7->super_Instr),
            pLVar7 != labelInstr) {
        (pLVar7->super_Instr).m_opcode = OVar9;
      }
      IR::Instr::Remove((Instr *)this_00);
      if ((labelInstr->field_0x78 & 4) == 0 &&
          (SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
          (labelInstr->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListNodeBase<Memory::ArenaAllocator>.next == &labelInstr->labelRefs) {
        nextInstr = PeepUnreachableLabel(labelInstr,isInHelper,(bool *)0x0);
      }
    }
  }
  return nextInstr;
}

Assistant:

IR::Instr*
Peeps::PeepCondMove(IR::LabelInstr *labelInstr, IR::Instr *nextInstr, const bool isInHelper)
{
    IR::Instr *instr = labelInstr->GetPrevRealInstrOrLabel();

    Js::OpCode newOpCode = Js::OpCode::InvalidOpCode;

    // Check if BB is all MOVs with both RegOpnd
    while(instr->m_opcode == Js::OpCode::MOV)
    {
        if (!instr->GetSrc1()->IsRegOpnd() || !instr->GetDst()->IsRegOpnd())
            return nextInstr;
        instr = instr->GetPrevRealInstrOrLabel();
    }

    // Did we hit a conditional branch ?
    if (instr->IsBranchInstr() && instr->AsBranchInstr()->IsConditional() &&
        !instr->AsBranchInstr()->IsMultiBranch() &&
        instr->AsBranchInstr()->GetTarget() == labelInstr &&
        instr->m_opcode != Js::OpCode::Leave)
    {
        IR::BranchInstr *brInstr = instr->AsBranchInstr();

        // Get the correct CMOVcc
        switch(brInstr->m_opcode)
        {
        case Js::OpCode::JA:
                newOpCode = Js::OpCode::CMOVBE;
                break;
        case Js::OpCode::JAE:
                newOpCode = Js::OpCode::CMOVB;
                break;
        case Js::OpCode::JB:
                newOpCode = Js::OpCode::CMOVAE;
                break;
        case Js::OpCode::JBE:
                newOpCode = Js::OpCode::CMOVA;
                break;
        case Js::OpCode::JEQ:
                newOpCode = Js::OpCode::CMOVNE;
                break;
        case Js::OpCode::JNE:
                newOpCode = Js::OpCode::CMOVE;
                break;
        case Js::OpCode::JNP:
                newOpCode = Js::OpCode::CMOVP;
                break;
        case Js::OpCode::JLT:
                newOpCode = Js::OpCode::CMOVGE;
                break;
        case Js::OpCode::JLE:
                newOpCode = Js::OpCode::CMOVG;
                break;
        case Js::OpCode::JGT:
                newOpCode = Js::OpCode::CMOVLE;
                break;
        case Js::OpCode::JGE:
                newOpCode = Js::OpCode::CMOVL;
                break;
        case Js::OpCode::JNO:
                newOpCode = Js::OpCode::CMOVO;
                break;
        case Js::OpCode::JO:
                newOpCode = Js::OpCode::CMOVNO;
                break;
        case Js::OpCode::JP:
                newOpCode = Js::OpCode::CMOVNP;
                break;
        case Js::OpCode::JNSB:
                newOpCode = Js::OpCode::CMOVS;
                break;
        case Js::OpCode::JSB:
                newOpCode = Js::OpCode::CMOVNS;
                break;
        default:
                Assert(UNREACHED);
                __assume(UNREACHED);
        }

        // convert the entire block to CMOVs
        instr = brInstr->GetNextRealInstrOrLabel();
        while(instr != labelInstr)
        {
            instr->m_opcode = newOpCode;
            instr = instr->GetNextRealInstrOrLabel();
        }

        // remove the Jcc
        brInstr->Remove();
        // We may have exposed an unreachable label by deleting the branch
        if (labelInstr->IsUnreferenced())
           return Peeps::PeepUnreachableLabel(labelInstr, isInHelper);
    }
    return nextInstr;
}